

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_bin_ugrid(REF_GRID ref_grid,char *filename,REF_BOOL swap_endian,REF_BOOL sixty_four_bit)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  uint uVar1;
  FILE *__s;
  size_t sVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG ntet;
  REF_LONG nqua;
  REF_LONG ntri;
  REF_INT faceid;
  REF_BOOL in_stack_ffffffffffffff68;
  FILE *in_stack_ffffffffffffff70;
  undefined4 uVar6;
  uint local_60;
  uint uStack_5c;
  REF_LONG local_58;
  REF_LONG local_50;
  REF_LONG local_48;
  REF_LONG local_40;
  REF_LONG local_38;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar1 = ref_node_synchronize_globals(ref_node);
  if (uVar1 == 0) {
    uVar1 = ref_cell_ncell(ref_grid->cell[3],ref_node,&local_38);
    if (uVar1 == 0) {
      uVar1 = ref_cell_ncell(ref_grid->cell[6],ref_node,&local_40);
      if (uVar1 == 0) {
        uVar1 = ref_cell_ncell(ref_grid->cell[8],ref_node,&local_48);
        if (uVar1 == 0) {
          uVar1 = ref_cell_ncell(ref_grid->cell[9],ref_node,&local_50);
          if (uVar1 == 0) {
            uVar1 = ref_cell_ncell(ref_grid->cell[10],ref_node,&local_58);
            if (uVar1 == 0) {
              uVar1 = ref_cell_ncell(ref_grid->cell[0xb],ref_node,(REF_LONG *)&local_60);
              if (uVar1 == 0) {
                if (ref_grid->mpi->id == 0) {
                  __s = fopen(filename,"w");
                  if (__s == (FILE *)0x0) {
                    printf("unable to open %s\n",filename);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xaf5,"ref_gather_bin_ugrid","unable to open file");
                    return 2;
                  }
                  if (sixty_four_bit == 0) {
                    uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff70 >> 0x20);
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "nnode";
                      uVar3 = 0xb12;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "ntri";
                      uVar3 = 0xb16;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "nqua";
                      uVar3 = 0xb19;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "ntet";
                      uVar3 = 0xb1d;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "npyr";
                      uVar3 = 0xb20;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "npri";
                      uVar3 = 0xb23;
                      goto LAB_00173d55;
                    }
                    uVar1 = local_60 >> 0x18 | (local_60 & 0xff0000) >> 8 | (local_60 & 0xff00) << 8
                            | local_60 << 0x18;
                    if (swap_endian == 0) {
                      uVar1 = local_60;
                    }
                    in_stack_ffffffffffffff70 = (FILE *)CONCAT44(uVar6,uVar1);
                    sVar2 = fwrite(&stack0xffffffffffffff70,4,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "nhex";
                      uVar3 = 0xb26;
                      goto LAB_00173d55;
                    }
                  }
                  else {
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "nnode";
                      uVar3 = 0xafa;
LAB_00173d55:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,uVar3,"ref_gather_bin_ugrid",pcVar5,1,sVar2);
                      return 1;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "ntri";
                      uVar3 = 0xafe;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "nqua";
                      uVar3 = 0xb01;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "ntet";
                      uVar3 = 0xb05;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "npyr";
                      uVar3 = 0xb08;
                      goto LAB_00173d55;
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "npri";
                      uVar3 = 0xb0b;
                      goto LAB_00173d55;
                    }
                    in_stack_ffffffffffffff70 =
                         (FILE *)((ulong)(uStack_5c >> 0x18) |
                                  (((ulong)uStack_5c & 0xff0000) << 0x20) >> 0x28 |
                                  (((ulong)uStack_5c & 0xff00) << 0x20) >> 0x18 |
                                  (((ulong)uStack_5c & 0xff) << 0x20) >> 8 |
                                  ((ulong)local_60 & 0xff000000) << 8 |
                                  ((ulong)local_60 & 0xff0000) << 0x18 |
                                  ((ulong)local_60 & 0xff00) << 0x28 |
                                 (long)CONCAT44(uStack_5c,local_60) << 0x38);
                    if (swap_endian == 0) {
                      in_stack_ffffffffffffff70 = (FILE *)CONCAT44(uStack_5c,local_60);
                    }
                    sVar2 = fwrite(&stack0xffffffffffffff70,8,1,__s);
                    if (sVar2 != 1) {
                      pcVar5 = "nhex";
                      uVar3 = 0xb0e;
                      goto LAB_00173d55;
                    }
                  }
                }
                else {
                  __s = (FILE *)0x0;
                }
                if (0 < ref_mpi->timing) {
                  ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
                }
                uVar1 = ref_gather_node(ref_node,swap_endian,0,0,(FILE *)__s);
                if (uVar1 == 0) {
                  if (0 < ref_mpi->timing) {
                    ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
                  }
                  faceid = (REF_INT)__s;
                  uVar1 = ref_gather_cell(ref_node,ref_grid->cell[3],0,0,swap_endian,sixty_four_bit,
                                          0,faceid,in_stack_ffffffffffffff68,
                                          in_stack_ffffffffffffff70);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xb38,"ref_gather_bin_ugrid",(ulong)uVar1,"tri c2n");
                    return uVar1;
                  }
                  uVar1 = ref_gather_cell(ref_node,ref_grid->cell[6],0,0,swap_endian,sixty_four_bit,
                                          0,faceid,in_stack_ffffffffffffff68,
                                          in_stack_ffffffffffffff70);
                  if (uVar1 == 0) {
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid face write");
                    }
                    uVar1 = ref_gather_cell(ref_node,ref_grid->cell[3],1,0,swap_endian,
                                            sixty_four_bit,0,faceid,in_stack_ffffffffffffff68,
                                            in_stack_ffffffffffffff70);
                    if (uVar1 == 0) {
                      uVar1 = ref_gather_cell(ref_node,ref_grid->cell[6],1,0,swap_endian,
                                              sixty_four_bit,0,faceid,in_stack_ffffffffffffff68,
                                              in_stack_ffffffffffffff70);
                      if (uVar1 == 0) {
                        if (0 < ref_mpi->timing) {
                          ref_mpi_stopwatch_stop(ref_mpi,"ugrid faceid write");
                        }
                        lVar4 = 10;
                        while (uVar1 = ref_gather_cell(ref_node,ref_grid->cell[lVar4 + -2],0,0,
                                                       swap_endian,sixty_four_bit,0,faceid,
                                                       in_stack_ffffffffffffff68,
                                                       in_stack_ffffffffffffff70), uVar1 == 0) {
                          if (0 < ref_mpi->timing) {
                            ref_mpi_stopwatch_stop(ref_mpi,"ugrid vol cell write");
                          }
                          lVar4 = lVar4 + 1;
                          if (lVar4 == 0x12) {
                            if (ref_grid->mpi->id == 0) {
                              fclose(__s);
                            }
                            return 0;
                          }
                        }
                        pcVar5 = "cell c2n";
                        uVar3 = 0xb56;
                      }
                      else {
                        pcVar5 = "qua faceid";
                        uVar3 = 0xb4b;
                      }
                    }
                    else {
                      pcVar5 = "tri faceid";
                      uVar3 = 0xb47;
                    }
                    goto LAB_00173448;
                  }
                  pcVar5 = "qua c2n";
                  uVar3 = 0xb3c;
                }
                else {
                  pcVar5 = "nodes";
                  uVar3 = 0xb2d;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar3,"ref_gather_bin_ugrid",(ulong)uVar1,pcVar5);
                return uVar1;
              }
              pcVar5 = "nhex";
              uVar3 = 0xaef;
            }
            else {
              pcVar5 = "npri";
              uVar3 = 0xaee;
            }
          }
          else {
            pcVar5 = "npyr";
            uVar3 = 0xaed;
          }
        }
        else {
          pcVar5 = "ntet";
          uVar3 = 0xaec;
        }
      }
      else {
        pcVar5 = "nqua";
        uVar3 = 0xaea;
      }
    }
    else {
      pcVar5 = "ntri";
      uVar3 = 0xae9;
    }
  }
  else {
    pcVar5 = "sync";
    uVar3 = 0xae5;
  }
LAB_00173448:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar3,
         "ref_gather_bin_ugrid",(ulong)uVar1,pcVar5);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_bin_ugrid(REF_GRID ref_grid,
                                               const char *filename,
                                               REF_BOOL swap_endian,
                                               REF_BOOL sixty_four_bit) {
  FILE *file;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB nnode;
  REF_LONG ntri, nqua, ntet, npyr, npri, nhex;
  REF_LONG size_long;
  REF_INT size_int;
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT faceid;
  REF_BOOL version = 0; /* meshb version, zero is no id */
  REF_BOOL faceid_insted_of_c2n, select_faceid;
  REF_BOOL pad = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = ref_node_n_global(ref_node);

  RSS(ref_cell_ncell(ref_grid_tri(ref_grid), ref_node, &ntri), "ntri");
  RSS(ref_cell_ncell(ref_grid_qua(ref_grid), ref_node, &nqua), "nqua");

  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "ntet");
  RSS(ref_cell_ncell(ref_grid_pyr(ref_grid), ref_node, &npyr), "npyr");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "npri");
  RSS(ref_cell_ncell(ref_grid_hex(ref_grid), ref_node, &nhex), "nhex");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    if (sixty_four_bit) {
      size_long = (REF_LONG)nnode;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "nnode");

      size_long = (REF_LONG)ntri;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "ntri");
      size_long = (REF_LONG)nqua;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "nqua");

      size_long = (REF_LONG)ntet;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "ntet");
      size_long = (REF_LONG)npyr;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "npyr");
      size_long = (REF_LONG)npri;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "npri");
      size_long = (REF_LONG)nhex;
      if (swap_endian) SWAP_LONG(size_long);
      REIS(1, fwrite(&size_long, sizeof(REF_LONG), 1, file), "nhex");
    } else {
      size_int = (REF_INT)nnode;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "nnode");

      size_int = (REF_INT)ntri;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "ntri");
      size_int = (REF_INT)nqua;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "nqua");

      size_int = (REF_INT)ntet;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "ntet");
      size_int = (REF_INT)npyr;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "npyr");
      size_int = (REF_INT)npri;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "npri");
      size_int = (REF_INT)nhex;
      if (swap_endian) SWAP_INT(size_int);
      REIS(1, fwrite(&size_int, sizeof(REF_INT), 1, file), "nhex");
    }
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  RSS(ref_gather_node(ref_node, swap_endian, version, REF_FALSE, file),
      "nodes");

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  faceid_insted_of_c2n = REF_FALSE;
  select_faceid = REF_FALSE;
  faceid = REF_EMPTY;
  RSS(ref_gather_cell(ref_node, ref_grid_tri(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "tri c2n");
  RSS(ref_gather_cell(ref_node, ref_grid_qua(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "qua c2n");

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid face write");

  faceid_insted_of_c2n = REF_TRUE;
  select_faceid = REF_FALSE;
  faceid = REF_EMPTY;
  RSS(ref_gather_cell(ref_node, ref_grid_tri(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "tri faceid");
  RSS(ref_gather_cell(ref_node, ref_grid_qua(ref_grid), faceid_insted_of_c2n,
                      version, swap_endian, sixty_four_bit, select_faceid,
                      faceid, pad, file),
      "qua faceid");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid faceid write");

  faceid_insted_of_c2n = REF_FALSE;
  select_faceid = REF_FALSE;
  faceid = REF_EMPTY;
  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, version,
                        swap_endian, sixty_four_bit, select_faceid, faceid, pad,
                        file),
        "cell c2n");
    if (0 < ref_mpi_timing(ref_mpi))
      ref_mpi_stopwatch_stop(ref_mpi, "ugrid vol cell write");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}